

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttrib64BitTest.cpp
# Opt level: O0

void __thiscall VertexAttrib64Bit::GetVertexAttribTest::initTest(GetVertexAttribTest *this)

{
  GLenum GVar1;
  GLint GVar2;
  GetVertexAttribTest *this_local;
  
  (*(this->super_Base).gl.genBuffers)(1,&this->m_buffer_object_id);
  GVar1 = (*(this->super_Base).gl.getError)();
  glu::checkError(GVar1,"GenBuffers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,0x3f8);
  (*(this->super_Base).gl.bindBuffer)(0x8892,this->m_buffer_object_id);
  GVar1 = (*(this->super_Base).gl.getError)();
  glu::checkError(GVar1,"BindBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,0x3fb);
  (*(this->super_Base).gl.bufferData)(0x8892,0x80,(void *)0x0,0x88e8);
  GVar1 = (*(this->super_Base).gl.getError)();
  glu::checkError(GVar1,"BufferStorage",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,0x3fe);
  (*(this->super_Base).gl.genVertexArrays)(1,&this->m_vertex_array_object_id);
  GVar1 = (*(this->super_Base).gl.getError)();
  glu::checkError(GVar1,"GenVertexArrays",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,0x401);
  GVar2 = Base::GetMaxVertexAttribs(&this->super_Base);
  this->m_max_vertex_attribs = GVar2;
  return;
}

Assistant:

void GetVertexAttribTest::initTest()
{
	gl.genBuffers(1, &m_buffer_object_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GenBuffers");

	gl.bindBuffer(GL_ARRAY_BUFFER, m_buffer_object_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindBuffer");

	gl.bufferData(GL_ARRAY_BUFFER, 16 * sizeof(GLdouble), 0, GL_DYNAMIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BufferStorage");

	gl.genVertexArrays(1, &m_vertex_array_object_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GenVertexArrays");

	m_max_vertex_attribs = GetMaxVertexAttribs();
}